

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O1

float embree::displacement_dv(Vec3fa *P,Vec3fa *dPdv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  
  fVar8 = (dPdv->field_0).m128[0];
  fVar10 = (dPdv->field_0).m128[1];
  fVar9 = (dPdv->field_0).m128[2];
  fVar1 = (dPdv->field_0).m128[3];
  fVar2 = (P->field_0).m128[0];
  fVar3 = (P->field_0).m128[1];
  fVar4 = (P->field_0).m128[2];
  fVar5 = (P->field_0).m128[3];
  fVar6 = 1.0;
  fVar11 = 0.0;
  do {
    local_28.m128[0] = fVar6 * (fVar8 * 0.001 + fVar2);
    local_28.m128[1] = fVar6 * (fVar10 * 0.001 + fVar3);
    local_28.m128[2] = fVar6 * (fVar9 * 0.001 + fVar4);
    local_28.m128[3] = fVar6 * (fVar1 * 0.001 + fVar5);
    fVar7 = noise((Vec3fa *)&local_28.field_1);
    fVar11 = fVar11 + (ABS(fVar7) * 1.4 * ABS(fVar7)) / fVar6;
    fVar6 = fVar6 + fVar6;
  } while (fVar6 < 40.0);
  fVar8 = 1.0;
  fVar10 = 0.0;
  do {
    local_28.m128[0] = fVar8 * (P->field_0).m128[0];
    local_28.m128[1] = fVar8 * (P->field_0).m128[1];
    local_28.m128[2] = fVar8 * (P->field_0).m128[2];
    local_28.m128[3] = fVar8 * (P->field_0).m128[3];
    fVar9 = noise((Vec3fa *)&local_28.field_1);
    fVar10 = fVar10 + (ABS(fVar9) * 1.4 * ABS(fVar9)) / fVar8;
    fVar8 = fVar8 + fVar8;
  } while (fVar8 < 40.0);
  return (fVar11 - fVar10) / 0.001;
}

Assistant:

float displacement_dv(const Vec3fa& P, const Vec3fa& dPdv)
{
  const float dv = 0.001f;
  return (displacement(P+dv*dPdv)-displacement(P))/dv;
}